

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckInternalVariables.cxx
# Opt level: O0

string * __thiscall
kws::Parser::FindInternalVariable_abi_cxx11_(Parser *this,size_t start,size_t end,size_t *pos)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  ulong in_RCX;
  long in_RSI;
  string *in_RDI;
  ulong *in_R8;
  size_t posstar;
  string subphrase;
  size_t j;
  bool isenum;
  string store;
  bool first;
  bool inWord;
  unsigned_long i;
  size_t posSemicolon;
  string *ivar;
  char *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  Parser *in_stack_fffffffffffffe78;
  byte local_161;
  allocator local_135;
  int local_134;
  string local_130 [32];
  long local_110;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  size_t local_80;
  byte local_71;
  string local_70 [52];
  allocator local_3c;
  byte local_3b;
  byte local_3a;
  byte local_39;
  long local_38;
  ulong local_30;
  ulong *local_28;
  ulong local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_30 = std::__cxx11::string::find((char *)(in_RSI + 0x518),0x1e54be);
  do {
    if (local_30 == 0xffffffffffffffff || local_20 <= local_30) {
      *local_28 = 0xffffffffffffffff;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"",&local_135);
      std::allocator<char>::~allocator((allocator<char> *)&local_135);
      return in_RDI;
    }
    local_38 = local_30 - 1;
    local_39 = 1;
    local_3a = 0;
    local_3b = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_3c);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c);
    while( true ) {
      local_161 = 0;
      if (local_38 != -1) {
        local_161 = local_39;
      }
      if ((local_161 & 1) == 0) break;
      pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI + 0x518);
      if ((*pcVar2 == ' ') ||
         (pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI + 0x518), *pcVar2 == '\t')) {
        if ((local_3a & 1) != 0) {
          local_39 = 0;
        }
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI + 0x518);
        if (((*pcVar2 == '}') ||
            (in_stack_fffffffffffffe78 = (Parser *)std::__cxx11::string::operator[](in_RSI + 0x518),
            *(char *)&(in_stack_fffffffffffffe78->m_ErrorList).
                      super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                      _M_impl.super__Vector_impl_data._M_start == ')')) ||
           ((in_stack_fffffffffffffe70 = (char *)std::__cxx11::string::operator[](in_RSI + 0x518),
            *in_stack_fffffffffffffe70 == ']' ||
            (in_stack_fffffffffffffe68 = (char *)std::__cxx11::string::operator[](in_RSI + 0x518),
            *in_stack_fffffffffffffe68 == '\n')))) {
          local_39 = 0;
        }
        else {
          std::__cxx11::string::string(local_70,(string *)in_RDI);
          in_stack_fffffffffffffe60 = (char *)std::__cxx11::string::operator[](in_RSI + 0x518);
          std::__cxx11::string::operator=((string *)in_RDI,*in_stack_fffffffffffffe60);
          std::__cxx11::string::operator+=((string *)in_RDI,local_70);
          local_39 = 1;
          local_3a = 1;
          std::__cxx11::string::~string(local_70);
        }
      }
      local_38 = local_38 + -1;
    }
    *local_28 = local_30;
    while ((((local_38 != -1 &&
             (pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI + 0x518), *pcVar2 != ';')) &&
            (pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI + 0x518), *pcVar2 != '}')) &&
           (((pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI + 0x518), *pcVar2 != ':' ||
             (pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI + 0x518), *pcVar2 == ':')) ||
            (pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI + 0x518), *pcVar2 == ':')))))
    {
      local_38 = local_38 + -1;
    }
    local_71 = 0;
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI + 0x518);
    if (*pcVar2 == '}') {
      local_80 = FindOpeningChar(in_stack_fffffffffffffe78,
                                 (char)((ulong)in_stack_fffffffffffffe70 >> 0x38),
                                 (char)((ulong)in_stack_fffffffffffffe70 >> 0x30),
                                 (size_t)in_stack_fffffffffffffe68,
                                 SUB81((ulong)in_stack_fffffffffffffe60 >> 0x38,0));
      while ((local_80 != 0 &&
             (pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI + 0x518), *pcVar2 != ';'))) {
        local_80 = local_80 - 1;
      }
      std::__cxx11::string::substr((ulong)local_a0,in_RSI + 0x518);
      lVar3 = std::__cxx11::string::find((char *)local_a0,0x1e5c88);
      std::__cxx11::string::~string(local_a0);
      if (lVar3 == -1) {
        std::__cxx11::string::substr((ulong)local_c0,in_RSI + 0x518);
        lVar3 = std::__cxx11::string::find((char *)local_c0,0x1e5b7b);
        std::__cxx11::string::~string(local_c0);
        if (lVar3 != -1) {
          local_71 = 1;
        }
      }
      else {
        local_71 = 1;
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"",&local_e1);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    std::__cxx11::string::substr((ulong)local_108,in_RSI + 0x518);
    std::__cxx11::string::operator=(local_e0,local_108);
    std::__cxx11::string::~string(local_108);
    lVar3 = std::__cxx11::string::find((char *)local_e0,0x1e627a);
    if (((((((lVar3 != -1) ||
            (lVar3 = std::__cxx11::string::find((char *)local_e0,0x1e54ca), lVar3 != -1)) ||
           (lVar3 = std::__cxx11::string::find((char *)local_e0,0x1e5b7b), lVar3 != -1)) ||
          ((lVar3 = std::__cxx11::string::find((char *)local_e0,0x1dce50), lVar3 != -1 ||
           (lVar3 = std::__cxx11::string::find((char *)local_e0,0x1e5fab), lVar3 != -1)))) ||
         ((lVar3 = std::__cxx11::string::find((char *)local_e0,0x1e60e6), lVar3 != -1 ||
          ((lVar3 = std::__cxx11::string::find((char *)local_e0,0x1e5c92), lVar3 != -1 ||
           (lVar3 = std::__cxx11::string::find((char *)local_e0,0x1e5fb2), lVar3 != -1)))))) ||
        (lVar3 = std::__cxx11::string::find((char *)local_e0,0x1e6ee3), lVar3 != -1)) ||
       (((lVar3 = std::__cxx11::string::find((char *)local_e0,0x1e5c07), lVar3 != -1 ||
         ((local_71 & 1) != 0)) ||
        (bVar1 = IsInFunction(in_stack_fffffffffffffe78,(size_t)in_stack_fffffffffffffe70,
                              in_stack_fffffffffffffe68), bVar1)))) {
      local_30 = std::__cxx11::string::find((char *)(in_RSI + 0x518),0x1e54be);
      local_134 = 0;
    }
    else {
      local_110 = std::__cxx11::string::find_last_of((char *)in_RDI,0x1d75d2);
      if (local_110 != -1) {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_130,(ulong)in_RDI);
        std::__cxx11::string::operator=((string *)in_RDI,local_130);
        std::__cxx11::string::~string(local_130);
      }
      local_3b = 1;
      local_134 = 1;
    }
    std::__cxx11::string::~string(local_e0);
    if ((local_3b & 1) == 0) {
      std::__cxx11::string::~string((string *)in_RDI);
    }
  } while (local_134 == 0);
  return in_RDI;
}

Assistant:

std::string Parser::FindInternalVariable(size_t start, size_t end,size_t & pos)
{
  size_t posSemicolon = m_BufferNoComment.find(";",start);
  while(posSemicolon != std::string::npos && posSemicolon<end)
    {
    // We try to find the word before that
    unsigned long i=static_cast<unsigned long>(posSemicolon)-1;
    bool inWord = true;
    bool first = false;
    std::string ivar = "";
    while(i != std::string::npos && inWord)
      {
      if((m_BufferNoComment[i] != ' ')
         && (m_BufferNoComment[i] != '\t')
        )
        {
        if((m_BufferNoComment[i] == '}')
          || (m_BufferNoComment[i] == ')')
          || (m_BufferNoComment[i] == ']')
          || (m_BufferNoComment[i] == '\n')
          )
          {
          inWord = false;
          }
        else
          {
          std::string store = ivar;
          ivar = m_BufferNoComment[i];
          ivar += store;
          inWord = true;
          first = true;
          }
        }
      else // we have a space
        {
        if(first)
          {
          inWord = false;
          }
        }
      i--;
      }
    pos = posSemicolon;
    // We extract the complete definition.
    // This means that we look for a '{' or '}' or '{' or ':'
    // but not '::'
    while(i != std::string::npos)
      {
      if(m_BufferNoComment[i] == ';'
        || m_BufferNoComment[i] == '}'
        )
        {
        break;
        }
      else if(m_BufferNoComment[i] == ':')
        {
        if((m_BufferNoComment[i-1] != ':') && (m_BufferNoComment[i+1] != ':'))
          {
          break;
          }
        }
      i--;
      }

    bool isenum = false;
    // If we have a '}' we check that this is not an enum definition
    // or a typedef
    if(m_BufferNoComment[i] == '}')
      {

      // Find the opening char
      size_t j = this->FindOpeningChar('}','{',i,true);
      // Find a semicolon before that
      while(j>0)
        {
        if(m_BufferNoComment[j] == ';')
          {
          break;
          }
        j--;
        }

      if(m_BufferNoComment.substr(j+1,i-j-1).find("enum") != std::string::npos)
        {
        isenum = true;
        }
      else if(m_BufferNoComment.substr(j+1,i-j-1).find("typedef") != std::string::npos)
        {
        isenum = true;
        }
     }

    std::string subphrase = "";
    subphrase = m_BufferNoComment.substr(i+1,posSemicolon-i-1);

    if( (subphrase.find("=") == std::string::npos)
      && (subphrase.find("(") == std::string::npos)
      && (subphrase.find("typedef") == std::string::npos)
      && (subphrase.find("}") == std::string::npos)
      && (subphrase.find("friend") == std::string::npos)
      && (subphrase.find("class") == std::string::npos)
      && (subphrase.find("return") == std::string::npos)
      && (subphrase.find("extern") == std::string::npos)
      && (subphrase.find("\"") == std::string::npos)
      && (subphrase.find("<<") == std::string::npos)
      && !isenum
      )
      {
      // Check that we are not inside a function(){}
      if(!this->IsInFunction(posSemicolon))
        {
        // We check if any * is present and strip
        // the work
        size_t posstar = ivar.find_last_of("*");
        if(posstar != std::string::npos)
          {
          ivar = ivar.substr(posstar+1,ivar.size()-posstar-1);
          }
        return ivar;
        }
      }
    posSemicolon = m_BufferNoComment.find(";",posSemicolon+1);
    }

  pos = std::string::npos;
  return "";
}